

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum_core.cpp
# Opt level: O3

int mbedtls_mpi_core_write_be(mbedtls_mpi_uint *X,size_t X_limbs,uchar *output,size_t output_length)

{
  size_t __n;
  long lVar1;
  byte bVar2;
  size_t sVar3;
  ulong uVar4;
  
  uVar4 = X_limbs * 8;
  __n = output_length + X_limbs * -8;
  if (output_length < uVar4 || __n == 0) {
    if (output_length < uVar4) {
      lVar1 = output_length * 8;
      sVar3 = output_length;
      do {
        if ((char)(*(ulong *)((long)X + (sVar3 & 0xfffffffffffffff8)) >> ((byte)lVar1 & 0x38)) !=
            '\0') {
          return -8;
        }
        sVar3 = sVar3 + 1;
        lVar1 = lVar1 + 8;
      } while (uVar4 != sVar3);
    }
  }
  else {
    memset(output,0,__n);
    output = output + X_limbs * -8 + output_length;
    output_length = uVar4;
  }
  if (output_length != 0) {
    bVar2 = 0;
    uVar4 = 0;
    do {
      output[output_length - 1] =
           (uchar)(*(ulong *)((long)X + (uVar4 & 0xfffffffffffffff8)) >> (bVar2 & 0x38));
      uVar4 = uVar4 + 1;
      bVar2 = bVar2 + 8;
      output_length = output_length - 1;
    } while (output_length != 0);
  }
  return 0;
}

Assistant:

int mbedtls_mpi_core_write_be(const mbedtls_mpi_uint *X,
                              size_t X_limbs,
                              unsigned char *output,
                              size_t output_length)
{
    size_t stored_bytes;
    size_t bytes_to_copy;
    unsigned char *p;

    stored_bytes = X_limbs * ciL;

    if (stored_bytes < output_length) {
        /* There is enough space in the output buffer. Write initial
         * null bytes and record the position at which to start
         * writing the significant bytes. In this case, the execution
         * trace of this function does not depend on the value of the
         * number. */
        bytes_to_copy = stored_bytes;
        p = output + output_length - stored_bytes;
        memset(output, 0, output_length - stored_bytes);
    } else {
        /* The output buffer is smaller than the allocated size of X.
         * However X may fit if its leading bytes are zero. */
        bytes_to_copy = output_length;
        p = output;
        for (size_t i = bytes_to_copy; i < stored_bytes; i++) {
            if (GET_BYTE(X, i) != 0) {
                return MBEDTLS_ERR_MPI_BUFFER_TOO_SMALL;
            }
        }
    }

    for (size_t i = 0; i < bytes_to_copy; i++) {
        p[bytes_to_copy - i - 1] = GET_BYTE(X, i);
    }

    return 0;
}